

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::AdamOptimizer::InternalSwap(AdamOptimizer *this,AdamOptimizer *other)

{
  AdamOptimizer *other_local;
  AdamOptimizer *this_local;
  
  std::swap<CoreML::Specification::DoubleParameter*>(&this->learningrate_,&other->learningrate_);
  std::swap<CoreML::Specification::Int64Parameter*>(&this->minibatchsize_,&other->minibatchsize_);
  std::swap<CoreML::Specification::DoubleParameter*>(&this->beta1_,&other->beta1_);
  std::swap<CoreML::Specification::DoubleParameter*>(&this->beta2_,&other->beta2_);
  std::swap<CoreML::Specification::DoubleParameter*>(&this->eps_,&other->eps_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void AdamOptimizer::InternalSwap(AdamOptimizer* other) {
  std::swap(learningrate_, other->learningrate_);
  std::swap(minibatchsize_, other->minibatchsize_);
  std::swap(beta1_, other->beta1_);
  std::swap(beta2_, other->beta2_);
  std::swap(eps_, other->eps_);
  std::swap(_cached_size_, other->_cached_size_);
}